

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  LodePNGState state;
  LodePNGState local_1d8;
  
  local_1d8._vptr_LodePNGState = (_func_int **)&PTR__LodePNGState_00115d98;
  lodepng_state_init(&local_1d8);
  local_1d8.info_raw.bitdepth = bitdepth;
  local_1d8.info_png.color.bitdepth = bitdepth;
  local_1d8.info_raw.colortype = colortype;
  local_1d8.info_png.color.colortype = colortype;
  lodepng_encode(out,outsize,image,w,h,&local_1d8);
  lodepng_state_cleanup(&local_1d8);
  return local_1d8.error;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}